

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrutil.c
# Opt level: O3

void png_handle_hIST(png_structrp png_ptr,png_inforp info_ptr,png_uint_32 length)

{
  int iVar1;
  char *error_message;
  ulong uVar2;
  png_byte buf [2];
  png_uint_16 readbuf [256];
  ushort local_22a;
  png_uint_16 local_228 [256];
  
  if ((png_ptr->mode & 1) == 0) {
    png_chunk_error(png_ptr,"missing IHDR");
  }
  if ((png_ptr->mode & 6) == 2) {
    if ((info_ptr == (png_inforp)0x0) || ((info_ptr->valid & 0x40) == 0)) {
      if ((((length & 1) == 0) && (length < 0x202)) && (length >> 1 == (uint)png_ptr->num_palette))
      {
        if (1 < length) {
          uVar2 = 0;
          do {
            png_crc_read(png_ptr,(png_bytep)&local_22a,2);
            local_228[uVar2] = local_22a << 8 | local_22a >> 8;
            uVar2 = uVar2 + 1;
          } while (length >> 1 != uVar2);
        }
        iVar1 = png_crc_finish(png_ptr,0);
        if (iVar1 == 0) {
          png_set_hIST(png_ptr,info_ptr,local_228);
        }
        return;
      }
      png_crc_finish(png_ptr,length);
      error_message = "invalid";
    }
    else {
      png_crc_finish(png_ptr,length);
      error_message = "duplicate";
    }
  }
  else {
    png_crc_finish(png_ptr,length);
    error_message = "out of place";
  }
  png_chunk_benign_error(png_ptr,error_message);
  return;
}

Assistant:

void /* PRIVATE */
png_handle_hIST(png_structrp png_ptr, png_inforp info_ptr, png_uint_32 length)
{
   unsigned int num, i;
   png_uint_16 readbuf[PNG_MAX_PALETTE_LENGTH];

   png_debug(1, "in png_handle_hIST");

   if ((png_ptr->mode & PNG_HAVE_IHDR) == 0)
      png_chunk_error(png_ptr, "missing IHDR");

   else if ((png_ptr->mode & PNG_HAVE_IDAT) != 0 ||
       (png_ptr->mode & PNG_HAVE_PLTE) == 0)
   {
      png_crc_finish(png_ptr, length);
      png_chunk_benign_error(png_ptr, "out of place");
      return;
   }

   else if (info_ptr != NULL && (info_ptr->valid & PNG_INFO_hIST) != 0)
   {
      png_crc_finish(png_ptr, length);
      png_chunk_benign_error(png_ptr, "duplicate");
      return;
   }

   num = length / 2 ;

   if (length != num * 2 ||
       num != (unsigned int)png_ptr->num_palette ||
       num > (unsigned int)PNG_MAX_PALETTE_LENGTH)
   {
      png_crc_finish(png_ptr, length);
      png_chunk_benign_error(png_ptr, "invalid");
      return;
   }

   for (i = 0; i < num; i++)
   {
      png_byte buf[2];

      png_crc_read(png_ptr, buf, 2);
      readbuf[i] = png_get_uint_16(buf);
   }

   if (png_crc_finish(png_ptr, 0) != 0)
      return;

   png_set_hIST(png_ptr, info_ptr, readbuf);
}